

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall
test_ethash_io_memo_file_size_mismatch::test_method(test_ethash_io_memo_file_size_mismatch *this)

{
  ethash_h256_t seedhash_00;
  ethash_h256_t seedhash_01;
  ethash_io_rc local_198;
  ethash_io_rc local_194;
  FILE *f;
  undefined **local_188;
  char *local_180;
  shared_count sStack_178;
  char *local_170;
  undefined8 **local_168;
  undefined1 local_160;
  undefined8 *local_158;
  undefined ***local_150;
  ethash_io_rc *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  shared_count sStack_128;
  path local_120;
  char *local_100;
  char *local_f8;
  ethash_h256_t seedhash;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  ethash_get_seedhash(&seedhash,0);
  f = (FILE *)0x0;
  local_40 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x115);
  local_180 = (char *)((ulong)local_180 & 0xffffffffffffff00);
  local_188 = &PTR__lazy_ostream_0013ea10;
  sStack_178.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_170 = "";
  local_198 = ETHASH_IO_MEMO_MISMATCH;
  seedhash_00.b[8] = seedhash.b[8];
  seedhash_00.b[9] = seedhash.b[9];
  seedhash_00.b[10] = seedhash.b[10];
  seedhash_00.b[0xb] = seedhash.b[0xb];
  seedhash_00.b[0xc] = seedhash.b[0xc];
  seedhash_00.b[0xd] = seedhash.b[0xd];
  seedhash_00.b[0xe] = seedhash.b[0xe];
  seedhash_00.b[0xf] = seedhash.b[0xf];
  seedhash_00.b[0] = seedhash.b[0];
  seedhash_00.b[1] = seedhash.b[1];
  seedhash_00.b[2] = seedhash.b[2];
  seedhash_00.b[3] = seedhash.b[3];
  seedhash_00.b[4] = seedhash.b[4];
  seedhash_00.b[5] = seedhash.b[5];
  seedhash_00.b[6] = seedhash.b[6];
  seedhash_00.b[7] = seedhash.b[7];
  seedhash_00.b[0x10] = seedhash.b[0x10];
  seedhash_00.b[0x11] = seedhash.b[0x11];
  seedhash_00.b[0x12] = seedhash.b[0x12];
  seedhash_00.b[0x13] = seedhash.b[0x13];
  seedhash_00.b[0x14] = seedhash.b[0x14];
  seedhash_00.b[0x15] = seedhash.b[0x15];
  seedhash_00.b[0x16] = seedhash.b[0x16];
  seedhash_00.b[0x17] = seedhash.b[0x17];
  seedhash_00.b[0x18] = seedhash.b[0x18];
  seedhash_00.b[0x19] = seedhash.b[0x19];
  seedhash_00.b[0x1a] = seedhash.b[0x1a];
  seedhash_00.b[0x1b] = seedhash.b[0x1b];
  seedhash_00.b[0x1c] = seedhash.b[0x1c];
  seedhash_00.b[0x1d] = seedhash.b[0x1d];
  seedhash_00.b[0x1e] = seedhash.b[0x1e];
  seedhash_00.b[0x1f] = seedhash.b[0x1f];
  local_194 = ethash_io_prepare("./test_ethash_directory/",seedhash_00,&f,0x40,false);
  local_148 = &local_194;
  local_138 = (char *)CONCAT71(local_138._1_7_,local_198 == local_194);
  local_130 = (char *)0x0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_100 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_f8 = "";
  local_150 = (undefined ***)&local_140;
  local_160 = 0;
  local_168 = (undefined8 **)&PTR__lazy_ostream_0013f0d0;
  local_158 = &boost::unit_test::lazy_ostream::inst;
  local_120.m_pathname.field_2._8_8_ = &local_148;
  local_120.m_pathname._M_string_length = local_120.m_pathname._M_string_length & 0xffffffffffffff00
  ;
  local_120.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0013f0d0;
  local_120.m_pathname.field_2._M_allocated_capacity =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  local_140 = (undefined1 *)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,&local_188,&local_100,0x115,2,2,2,"ETHASH_IO_MEMO_MISMATCH",&local_168,
             "ethash_io_prepare(\"./test_ethash_directory/\", seedhash, &f, 64, false)",&local_120);
  boost::detail::shared_count::~shared_count(&sStack_128);
  local_60 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x116);
  local_120.m_pathname._M_dataplus._M_p._0_1_ = f != (FILE *)0x0;
  local_120.m_pathname._M_string_length = 0;
  local_120.m_pathname.field_2._M_allocated_capacity = 0;
  local_188 = (undefined **)0x12d53a;
  local_180 = "";
  local_160 = 0;
  local_168 = (undefined8 **)&PTR__lazy_ostream_0013f110;
  local_158 = &boost::unit_test::lazy_ostream::inst;
  local_80 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_78 = "";
  local_150 = &local_188;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_120.m_pathname.field_2._M_allocated_capacity);
  fclose((FILE *)f);
  local_90 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x11a);
  local_168 = &local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_168,"./test_ethash_directory/","");
  boost::filesystem::detail::status(&local_120,(error_code *)&local_168);
  local_188 = (undefined **)
              CONCAT71(local_188._1_7_,(int)local_120.m_pathname._M_dataplus._M_p == 3);
  local_180 = (char *)0x0;
  sStack_178.pi_ = (sp_counted_base *)0x0;
  local_138 = "fs::is_directory(fs::path(\"./test_ethash_directory/\"))";
  local_130 = "";
  local_120.m_pathname._M_string_length = local_120.m_pathname._M_string_length & 0xffffffffffffff00
  ;
  local_120.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0013f110;
  local_120.m_pathname.field_2._M_allocated_capacity =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  local_120.m_pathname.field_2._8_8_ = &local_138;
  local_b0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_a8 = "";
  boost::test_tools::tt_detail::report_assertion(&local_188,&local_120,&local_b0,0x11a,2,0,0);
  boost::detail::shared_count::~shared_count(&sStack_178);
  if (local_168 != &local_158) {
    operator_delete(local_168);
  }
  local_c0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_b8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x11f);
  local_180 = (char *)((ulong)local_180 & 0xffffffffffffff00);
  local_188 = &PTR__lazy_ostream_0013ea10;
  sStack_178.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_170 = "";
  local_198 = ETHASH_IO_MEMO_SIZE_MISMATCH;
  seedhash_01.b[8] = seedhash.b[8];
  seedhash_01.b[9] = seedhash.b[9];
  seedhash_01.b[10] = seedhash.b[10];
  seedhash_01.b[0xb] = seedhash.b[0xb];
  seedhash_01.b[0xc] = seedhash.b[0xc];
  seedhash_01.b[0xd] = seedhash.b[0xd];
  seedhash_01.b[0xe] = seedhash.b[0xe];
  seedhash_01.b[0xf] = seedhash.b[0xf];
  seedhash_01.b[0] = seedhash.b[0];
  seedhash_01.b[1] = seedhash.b[1];
  seedhash_01.b[2] = seedhash.b[2];
  seedhash_01.b[3] = seedhash.b[3];
  seedhash_01.b[4] = seedhash.b[4];
  seedhash_01.b[5] = seedhash.b[5];
  seedhash_01.b[6] = seedhash.b[6];
  seedhash_01.b[7] = seedhash.b[7];
  seedhash_01.b[0x10] = seedhash.b[0x10];
  seedhash_01.b[0x11] = seedhash.b[0x11];
  seedhash_01.b[0x12] = seedhash.b[0x12];
  seedhash_01.b[0x13] = seedhash.b[0x13];
  seedhash_01.b[0x14] = seedhash.b[0x14];
  seedhash_01.b[0x15] = seedhash.b[0x15];
  seedhash_01.b[0x16] = seedhash.b[0x16];
  seedhash_01.b[0x17] = seedhash.b[0x17];
  seedhash_01.b[0x18] = seedhash.b[0x18];
  seedhash_01.b[0x19] = seedhash.b[0x19];
  seedhash_01.b[0x1a] = seedhash.b[0x1a];
  seedhash_01.b[0x1b] = seedhash.b[0x1b];
  seedhash_01.b[0x1c] = seedhash.b[0x1c];
  seedhash_01.b[0x1d] = seedhash.b[0x1d];
  seedhash_01.b[0x1e] = seedhash.b[0x1e];
  seedhash_01.b[0x1f] = seedhash.b[0x1f];
  local_194 = ethash_io_prepare("./test_ethash_directory/",seedhash_01,&f,0x41,false);
  local_138 = (char *)CONCAT71(local_138._1_7_,local_198 == local_194);
  local_130 = (char *)0x0;
  sStack_128.pi_ = (sp_counted_base *)0x0;
  local_100 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp";
  local_f8 = "";
  local_160 = 0;
  local_168 = (undefined8 **)&PTR__lazy_ostream_0013f0d0;
  local_158 = &boost::unit_test::lazy_ostream::inst;
  local_150 = (undefined ***)&local_140;
  local_148 = &local_194;
  local_120.m_pathname._M_string_length = local_120.m_pathname._M_string_length & 0xffffffffffffff00
  ;
  local_120.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0013f0d0;
  local_120.m_pathname.field_2._M_allocated_capacity =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  local_120.m_pathname.field_2._8_8_ = &local_148;
  local_140 = (undefined1 *)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,&local_188,&local_100,0x11f,2,2,2,"ETHASH_IO_MEMO_SIZE_MISMATCH",
             (error_code *)&local_168,
             "ethash_io_prepare(\"./test_ethash_directory/\", seedhash, &f, 65, false)",&local_120);
  boost::detail::shared_count::~shared_count(&sStack_128);
  local_168 = &local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_168,"./test_ethash_directory/","");
  boost::filesystem::detail::remove_all((path *)&local_168,(error_code *)0x0);
  if (local_168 != &local_158) {
    operator_delete(local_168);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ethash_io_memo_file_size_mismatch) {
	static const int blockn = 0;
	ethash_h256_t seedhash = ethash_get_seedhash(blockn);
	FILE *f = NULL;
	BOOST_REQUIRE_EQUAL(
		ETHASH_IO_MEMO_MISMATCH,
		ethash_io_prepare("./test_ethash_directory/", seedhash, &f, 64, false)
	);
	BOOST_REQUIRE(f);
	fclose(f);

	// let's make sure that the directory was created
	BOOST_REQUIRE(fs::is_directory(fs::path("./test_ethash_directory/")));
	// and check that we get the size mismatch detected if we request diffferent size
	BOOST_REQUIRE_EQUAL(
		ETHASH_IO_MEMO_SIZE_MISMATCH,
		ethash_io_prepare("./test_ethash_directory/", seedhash, &f, 65, false)
	);

	// cleanup
	fs::remove_all("./test_ethash_directory/");
}